

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderInvarianceTests.cpp
# Opt level: O1

ShaderPair * __thiscall
deqp::gles2::Functional::anon_unknown_1::BasicInvarianceTest::genShaders
          (ShaderPair *__return_storage_ptr__,BasicInvarianceTest *this)

{
  (__return_storage_ptr__->vertexShaderSource0)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->vertexShaderSource0).field_2;
  (__return_storage_ptr__->vertexShaderSource0)._M_string_length = 0;
  (__return_storage_ptr__->vertexShaderSource0).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->fragmentShaderSource0)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->fragmentShaderSource0).field_2;
  (__return_storage_ptr__->fragmentShaderSource0)._M_string_length = 0;
  (__return_storage_ptr__->fragmentShaderSource0).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->vertexShaderSource1)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->vertexShaderSource1).field_2;
  (__return_storage_ptr__->vertexShaderSource1)._M_string_length = 0;
  (__return_storage_ptr__->vertexShaderSource1).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->fragmentShaderSource1)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->fragmentShaderSource1).field_2;
  (__return_storage_ptr__->fragmentShaderSource1)._M_string_length = 0;
  (__return_storage_ptr__->fragmentShaderSource1).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->vertexShaderSource1);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->fragmentShaderSource0);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->fragmentShaderSource1);
  return __return_storage_ptr__;
}

Assistant:

BasicInvarianceTest::ShaderPair BasicInvarianceTest::genShaders (void) const
{
	ShaderPair retVal;

	retVal.vertexShaderSource0 = m_vertexShader1;
	retVal.vertexShaderSource1 = m_vertexShader2;
	retVal.fragmentShaderSource0 = m_fragmentShader;
	retVal.fragmentShaderSource1 = m_fragmentShader;

	return retVal;
}